

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeSection
          (SonarQubeReporter *this,string *rootName,SectionNode *sectionNode,bool okToFail)

{
  bool bVar1;
  ulong uVar2;
  reference this_00;
  SectionNode *sectionNode_00;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *__range1;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  bool okToFail_local;
  SectionNode *sectionNode_local;
  string *rootName_local;
  SonarQubeReporter *this_local;
  
  name.field_2._M_local_buf[0xf] = okToFail;
  trim((string *)local_48,(string *)sectionNode);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_88,rootName,'/');
    std::operator+(&local_68,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  if (((bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"testCase",&local_c9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)&this->xml,(XmlFormatting)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_e0 = operator____sr("name",4);
    StringRef::StringRef(&local_f0,(string *)local_48);
    XmlWriter::writeAttribute(&this->xml,local_e0,local_f0);
    local_100 = operator____sr("duration",8);
    __range1 = (vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(long)((sectionNode->stats).durationInSeconds * 1000.0);
    XmlWriter::writeAttribute<long,void>(&this->xml,local_100,(long *)&__range1);
    writeAssertions(this,sectionNode,(bool)(name.field_2._M_local_buf[0xf] & 1));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  }
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ::begin(&sectionNode->childSections);
  childNode = (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
              std::
              vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::end(&sectionNode->childSections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                                     *)&childNode), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ::operator*(&__end1);
    sectionNode_00 =
         Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    writeSection(this,(string *)local_48,sectionNode_00,(bool)(name.field_2._M_local_buf[0xf] & 1));
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void SonarQubeReporter::writeSection(std::string const& rootName, SectionNode const& sectionNode, bool okToFail) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if ( sectionNode.hasAnyAssertions()
            || !sectionNode.stdOut.empty()
            ||  !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement("testCase");
            xml.writeAttribute("name"_sr, name);
            xml.writeAttribute("duration"_sr, static_cast<long>(sectionNode.stats.durationInSeconds * 1000));

            writeAssertions(sectionNode, okToFail);
        }

        for (auto const& childNode : sectionNode.childSections)
            writeSection(name, *childNode, okToFail);
    }